

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

ScalarFunction *
duckdb::AddFunction::GetFunction(ScalarFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType varargs;
  LogicalType varargs_00;
  string *this;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb4;
  FunctionNullHandling in_stack_fffffffffffffec0;
  allocator_type local_13a;
  allocator local_139;
  bind_lambda_function_t in_stack_fffffffffffffec8;
  scalar_function_t local_120;
  scalar_function_t local_100;
  LogicalType local_e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_c8;
  LogicalType local_b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  LogicalType local_80;
  string local_68;
  LogicalType local_48;
  string local_30;
  
  if (type->id_ == DECIMAL) {
    ::std::__cxx11::string::string((string *)&local_30,"+",&local_139);
    LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffec8,type);
    __l._M_len = 1;
    __l._M_array = (iterator)&stack0xfffffffffffffec8;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_98,__l,&local_13a);
    LogicalType::LogicalType(&local_b0,type);
    local_100.super__Function_base._M_functor._8_8_ = 0;
    local_100.super__Function_base._M_functor._M_unused._M_object = ScalarFunction::NopFunction;
    local_100._M_invoker =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_invoke;
    local_100.super__Function_base._M_manager =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_manager;
    LogicalType::LogicalType(&local_48,INVALID);
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs._0_8_ = &local_48;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffeac;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffeb4;
    ScalarFunction::ScalarFunction
              (__return_storage_ptr__,&local_30,(vector<duckdb::LogicalType,_true> *)&local_98,
               &local_b0,&local_100,NopDecimalBind,(bind_scalar_function_extended_t)0x0,
               (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
    LogicalType::~LogicalType(&local_48);
    ::std::_Function_base::~_Function_base(&local_100.super__Function_base);
    LogicalType::~LogicalType(&local_b0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
    LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffec8);
    this = &local_30;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_68,"+",&local_139);
    LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffec8,type);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&stack0xfffffffffffffec8;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_c8,__l_00,&local_13a);
    LogicalType::LogicalType(&local_e0,type);
    local_120.super__Function_base._M_functor._8_8_ = 0;
    local_120.super__Function_base._M_functor._M_unused._M_object = ScalarFunction::NopFunction;
    local_120._M_invoker =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_invoke;
    local_120.super__Function_base._M_manager =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_manager;
    LogicalType::LogicalType(&local_80,INVALID);
    varargs_00.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs_00._0_8_ = &local_80;
    varargs_00.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffeac;
    varargs_00.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs_00.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffeb4;
    ScalarFunction::ScalarFunction
              (__return_storage_ptr__,&local_68,(vector<duckdb::LogicalType,_true> *)&local_c8,
               &local_e0,&local_120,(bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0
               ,(function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
    LogicalType::~LogicalType(&local_80);
    ::std::_Function_base::~_Function_base(&local_120.super__Function_base);
    LogicalType::~LogicalType(&local_e0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_c8);
    LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffec8);
    this = &local_68;
  }
  ::std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

ScalarFunction AddFunction::GetFunction(const LogicalType &type) {
	D_ASSERT(type.IsNumeric());
	if (type.id() == LogicalTypeId::DECIMAL) {
		return ScalarFunction("+", {type}, type, ScalarFunction::NopFunction, NopDecimalBind);
	} else {
		return ScalarFunction("+", {type}, type, ScalarFunction::NopFunction);
	}
}